

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintInstruction(InstructionRegVmLowerGraphContext *ctx,char *constantData,
                     RegVmLoweredInstruction *lowInstruction)

{
  OutputContext *pOVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  char *pcVar6;
  bool bVar7;
  uint local_74;
  uint local_50;
  uint local_4c;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint endOffset;
  uint startOffset;
  char *end;
  char *start;
  RegVmLoweredInstruction *lowInstruction_local;
  char *constantData_local;
  InstructionRegVmLowerGraphContext *ctx_local;
  
  if ((((ctx->showSource & 1U) != 0) && (lowInstruction->location != (SynBase *)0x0)) &&
     ((lowInstruction->location->isInternal & 1U) == 0)) {
    _endOffset = (lowInstruction->location->pos).begin;
    end = _endOffset;
    while( true ) {
      bVar7 = false;
      if ((ctx->code < end) && (bVar7 = false, end[-1] != '\r')) {
        bVar7 = end[-1] != '\n';
      }
      if (!bVar7) break;
      end = end + -1;
    }
    do {
      _endOffset = _endOffset + 1;
      bVar7 = false;
      if ((*_endOffset != '\0') && (bVar7 = false, *_endOffset != '\r')) {
        bVar7 = *_endOffset != '\n';
      }
    } while (bVar7);
    iVar2 = (int)end;
    if ((ctx->showAnnotatedSource & 1U) == 0) {
      if (end != ctx->lastStart) {
        Print(ctx->output,"// %.*s",(ulong)(uint)((int)_endOffset - iVar2),end);
        PrintLine(ctx->output);
        PrintIndent(ctx->output);
        ctx->lastStart = end;
      }
    }
    else {
      uVar3 = (int)(lowInstruction->location->pos).begin - iVar2;
      uVar4 = (int)(lowInstruction->location->pos).end - iVar2;
      if (((end != ctx->lastStart) || (uVar3 != ctx->lastStartOffset)) ||
         (uVar4 != ctx->lastEndOffset)) {
        Print(ctx->output,"// %.*s",(ulong)(uint)((int)_endOffset - iVar2),end);
        PrintLine(ctx->output);
        PrintIndent(ctx->output);
        if ((lowInstruction->location->pos).end < _endOffset) {
          Print(ctx->output,"// ");
          for (i_2 = 0; i_3 = uVar3, i_2 < uVar3; i_2 = i_2 + 1) {
            Print(ctx->output," ");
            if (end[i_2] == '\t') {
              pcVar6 = "   ";
              if (i_2 == 0) {
                pcVar6 = "  ";
              }
              Print(ctx->output,pcVar6);
            }
          }
          for (; i_3 < uVar4; i_3 = i_3 + 1) {
            Print(ctx->output,"~");
            if (end[i_3] == '\t') {
              pcVar6 = "~~~";
              if (i_3 == 0) {
                pcVar6 = "~~";
              }
              Print(ctx->output,pcVar6);
            }
          }
          PrintLine(ctx->output);
          PrintIndent(ctx->output);
        }
        ctx->lastStart = end;
        ctx->lastStartOffset = uVar3;
        ctx->lastEndOffset = uVar4;
      }
    }
  }
  if (lowInstruction->argument == (VmConstant *)0x0) {
    local_74 = 0;
  }
  else {
    local_74 = lowInstruction->argument->iValue;
  }
  PrintInstruction(ctx->output,constantData,(ExternFuncInfo *)0x0,(char *)0x0,lowInstruction->code,
                   lowInstruction->rA,lowInstruction->rB,lowInstruction->rC,local_74,
                   lowInstruction->argument);
  bVar7 = SmallArray<unsigned_char,_8U>::empty(&lowInstruction->preKillRegisters);
  if ((!bVar7) ||
     (bVar7 = SmallArray<unsigned_char,_8U>::empty(&lowInstruction->postKillRegisters), !bVar7)) {
    Print(ctx->output,"\t// kill[");
    for (local_4c = 0;
        uVar3 = SmallArray<unsigned_char,_8U>::size(&lowInstruction->preKillRegisters),
        local_4c < uVar3; local_4c = local_4c + 1) {
      if (local_4c != 0) {
        Print(ctx->output,", ");
      }
      pOVar1 = ctx->output;
      pbVar5 = SmallArray<unsigned_char,_8U>::operator[](&lowInstruction->preKillRegisters,local_4c)
      ;
      Print(pOVar1,"r%d*",(ulong)*pbVar5);
    }
    for (local_50 = 0;
        uVar3 = SmallArray<unsigned_char,_8U>::size(&lowInstruction->postKillRegisters),
        local_50 < uVar3; local_50 = local_50 + 1) {
      if ((local_50 != 0) ||
         (bVar7 = SmallArray<unsigned_char,_8U>::empty(&lowInstruction->preKillRegisters), !bVar7))
      {
        Print(ctx->output,", ");
      }
      pOVar1 = ctx->output;
      pbVar5 = SmallArray<unsigned_char,_8U>::operator[]
                         (&lowInstruction->postKillRegisters,local_50);
      Print(pOVar1,"r%d",(ulong)*pbVar5);
    }
    Print(ctx->output,"]");
  }
  PrintLine(ctx->output);
  return;
}

Assistant:

void PrintInstruction(InstructionRegVmLowerGraphContext &ctx, char *constantData, RegVmLoweredInstruction *lowInstruction)
{
	if(ctx.showSource && lowInstruction->location && !lowInstruction->location->isInternal)
	{
		const char *start = lowInstruction->location->pos.begin;
		const char *end = start + 1;

		// TODO: handle source locations from imported modules
		while(start > ctx.code && *(start - 1) != '\r' && *(start - 1) != '\n')
			start--;

		while(*end && *end != '\r' && *end != '\n')
			end++;

		if (ctx.showAnnotatedSource)
		{
			unsigned startOffset = unsigned(lowInstruction->location->pos.begin - start);
			unsigned endOffset = unsigned(lowInstruction->location->pos.end - start);

			if(start != ctx.lastStart || startOffset != ctx.lastStartOffset || endOffset != ctx.lastEndOffset)
			{
				Print(ctx.output, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx.output);
				PrintIndent(ctx.output);

				if (lowInstruction->location->pos.end < end)
				{
					Print(ctx.output, "// ");

					for (unsigned i = 0; i < startOffset; i++)
					{
						Print(ctx.output, " ");

						if (start[i] == '\t')
							Print(ctx.output, i == 0 ? "  " : "   ");
					}

					for (unsigned i = startOffset; i < endOffset; i++)
					{
						Print(ctx.output, "~");

						if (start[i] == '\t')
							Print(ctx.output, i == 0 ? "~~" : "~~~");
					}

					PrintLine(ctx.output);
					PrintIndent(ctx.output);
				}

				ctx.lastStart = start;
				ctx.lastStartOffset = startOffset;
				ctx.lastEndOffset = endOffset;
			}
		}
		else
		{
			if(start != ctx.lastStart)
			{
				Print(ctx.output, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx.output);
				PrintIndent(ctx.output);

				ctx.lastStart = start;
			}
		}
	}

	PrintInstruction(ctx.output, constantData, NULL, NULL, RegVmInstructionCode(lowInstruction->code), lowInstruction->rA, lowInstruction->rB, lowInstruction->rC, lowInstruction->argument ? lowInstruction->argument->iValue : 0, lowInstruction->argument);

	if(!lowInstruction->preKillRegisters.empty() || !lowInstruction->postKillRegisters.empty())
	{
		Print(ctx.output, "\t// kill[");

		for(unsigned i = 0; i < lowInstruction->preKillRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d*", lowInstruction->preKillRegisters[i]);
		}

		for(unsigned i = 0; i < lowInstruction->postKillRegisters.size(); i++)
		{
			if(i != 0 || !lowInstruction->preKillRegisters.empty())
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowInstruction->postKillRegisters[i]);
		}

		Print(ctx.output, "]");
	}

	PrintLine(ctx.output);
}